

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::MessageLite::SerializeWithCachedSizesToArray(MessageLite *this,uint8 *target)

{
  int size;
  LogMessage *other;
  CodedOutputStream coded_out;
  ArrayOutputStream out;
  LogFinisher local_99;
  CodedOutputStream local_98;
  ArrayOutputStream local_78;
  LogMessage local_58;
  
  size = (*this->_vptr_MessageLite[0xc])();
  io::ArrayOutputStream::ArrayOutputStream(&local_78,target,size,-1);
  io::CodedOutputStream::CodedOutputStream(&local_98,&local_78.super_ZeroCopyOutputStream);
  (*this->_vptr_MessageLite[10])(this,&local_98);
  if (local_98.had_error_ == true) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0xe0);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: !coded_out.HadError(): ");
    internal::LogFinisher::operator=(&local_99,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  io::CodedOutputStream::~CodedOutputStream(&local_98);
  io::ArrayOutputStream::~ArrayOutputStream(&local_78);
  return target + size;
}

Assistant:

uint8* MessageLite::SerializeWithCachedSizesToArray(uint8* target) const {
  // We only optimize this when using optimize_for = SPEED.  In other cases
  // we just use the CodedOutputStream path.
  int size = GetCachedSize();
  io::ArrayOutputStream out(target, size);
  io::CodedOutputStream coded_out(&out);
  SerializeWithCachedSizes(&coded_out);
  GOOGLE_CHECK(!coded_out.HadError());
  return target + size;
}